

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  bool bVar1;
  KeyValue *__last;
  KeyValue *pKVar2;
  KeyValue *it;
  KeyValue *end;
  ExtensionSet *pEStack_10;
  int key_local;
  ExtensionSet *this_local;
  
  end._4_4_ = key;
  pEStack_10 = this;
  bVar1 = is_large(this);
  if (bVar1) {
    std::
    map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             *)(this->map_).flat,(key_type_conflict *)((long)&end + 4));
  }
  else {
    __last = flat_end(this);
    pKVar2 = flat_begin(this);
    pKVar2 = std::
             lower_bound<google::protobuf::internal::ExtensionSet::KeyValue*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                       (pKVar2,__last,(long)&end + 4);
    if ((pKVar2 != __last) && (pKVar2->first == end._4_4_)) {
      std::
      copy<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue*>
                (pKVar2 + 1,__last,pKVar2);
      this->flat_size_ = this->flat_size_ - 1;
    }
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    std::copy(it + 1, end, it);
    --flat_size_;
  }
}